

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O1

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::extract_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,size_t root_id)

{
  pointer *ppNVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  iterator iVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  pointer pNVar8;
  pointer pNVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  _Elt_pointer ppVar13;
  unsigned_long *__first;
  stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  stack;
  uint local_ac;
  undefined8 local_a8;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_a0;
  back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_98;
  size_t local_90;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_88;
  
  local_a0 = this;
  local_90 = root_id;
  if (root_id != 0) {
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->prim_ids).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar5._M_current =
         (__return_storage_ptr__->nodes).
         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->nodes).
        super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
      ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,iVar5);
    }
    else {
      *(undefined1 (*) [16])(((iVar5._M_current)->bounds)._M_elems + 3) = ZEXT416(0) << 0x40;
      *(undefined1 (*) [16])((iVar5._M_current)->bounds)._M_elems = ZEXT416(0) << 0x40;
      ppNVar1 = &(__return_storage_ptr__->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::_M_initialize_map(&local_88,0);
    local_a8 = (ulong)local_a8._4_4_ << 0x20;
    std::
    deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long&,int>
              ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&local_88,&local_90,(int *)&local_a8);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_98.container = &__return_storage_ptr__->prim_ids;
      do {
        ppVar13 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar6 = ppVar13[-1].first;
        uVar7 = ppVar13[-1].second;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        pNVar8 = (local_a0->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar9 = (__return_storage_ptr__->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = *(undefined8 *)pNVar8[uVar6].bounds._M_elems;
        uVar11 = *(undefined8 *)((long)pNVar8[uVar6].bounds._M_elems + 8);
        pfVar2 = (float *)((long)pNVar8[uVar6].bounds._M_elems + 0xc);
        uVar12 = *(undefined8 *)(pfVar2 + 2);
        pfVar3 = (float *)((long)pNVar9[uVar7].bounds._M_elems + 0xc);
        *(undefined8 *)pfVar3 = *(undefined8 *)pfVar2;
        *(undefined8 *)(pfVar3 + 2) = uVar12;
        *(undefined8 *)pNVar9[uVar7].bounds._M_elems = uVar10;
        *(undefined8 *)((long)pNVar9[uVar7].bounds._M_elems + 8) = uVar11;
        if ((pNVar8[uVar6].index.value & 0xf) == 0) {
          Index<32UL,_4UL>::Index
                    ((Index<32UL,_4UL> *)&local_a8,
                     ((long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7,
                     (ulong)(pNVar9[uVar7].index.value & 0xf));
          pNVar9[uVar7].index.value = local_a8._0_4_;
          local_ac = pNVar8[uVar6].index.value >> 4;
          local_a8 = ((long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
          std::
          deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<unsigned_int,unsigned_long>
                    ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)&local_88,&local_ac,(unsigned_long *)&local_a8);
          local_ac = (pNVar8[uVar6].index.value >> 4) + 1;
          local_a8 = ((long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 + 1
          ;
          std::
          deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<unsigned_int,unsigned_long>
                    ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)&local_88,&local_ac,(unsigned_long *)&local_a8);
          iVar5._M_current =
               (__return_storage_ptr__->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,iVar5);
          }
          else {
            ((iVar5._M_current)->bounds)._M_elems[3] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[4] = 0.0;
            *(undefined8 *)(((iVar5._M_current)->bounds)._M_elems + 5) = 0;
            ((iVar5._M_current)->bounds)._M_elems[0] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[1] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[2] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[3] = 0.0;
            ppNVar1 = &(__return_storage_ptr__->nodes).
                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppNVar1 = *ppNVar1 + 1;
          }
          iVar5._M_current =
               (__return_storage_ptr__->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,iVar5);
          }
          else {
            ((iVar5._M_current)->bounds)._M_elems[3] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[4] = 0.0;
            *(undefined8 *)(((iVar5._M_current)->bounds)._M_elems + 5) = 0;
            ((iVar5._M_current)->bounds)._M_elems[0] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[1] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[2] = 0.0;
            ((iVar5._M_current)->bounds)._M_elems[3] = 0.0;
            ppNVar1 = &(__return_storage_ptr__->nodes).
                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppNVar1 = *ppNVar1 + 1;
          }
        }
        else {
          Index<32UL,_4UL>::Index
                    ((Index<32UL,_4UL> *)&local_a8,
                     (long)(__return_storage_ptr__->prim_ids).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->prim_ids).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3,
                     (ulong)(pNVar9[uVar7].index.value & 0xf));
          pNVar9[uVar7].index.value = local_a8._0_4_;
          uVar4 = pNVar8[uVar6].index.value;
          if ((uVar4 & 0xf) != 0) {
            __first = (local_a0->prim_ids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + (uVar4 >> 4);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<unsigned_long_const*,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (__first,__first + ((ulong)uVar4 & 0xf),local_98);
          }
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base(&local_88);
    return __return_storage_ptr__;
  }
  __assert_fail("root_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/bvh.h"
                ,0x5d,
                "Bvh<Node> bvh::v2::Bvh<bvh::v2::Node<float, 3>>::extract_bvh(size_t) const [Node = bvh::v2::Node<float, 3>]"
               );
}

Assistant:

Bvh<Node> Bvh<Node>::extract_bvh(size_t root_id) const {
    assert(root_id != 0);

    Bvh bvh;
    bvh.nodes.emplace_back();

    std::stack<std::pair<size_t, size_t>> stack;
    stack.emplace(root_id, 0);
    while (!stack.empty()) {
        auto [src_id, dst_id] = stack.top();
        stack.pop();
        const auto& src_node = nodes[src_id];
        auto& dst_node = bvh.nodes[dst_id];
        dst_node = src_node;
        if (src_node.is_leaf()) {
            dst_node.index.set_first_id(bvh.prim_ids.size());
            std::copy_n(
                prim_ids.begin() + src_node.index.first_id(),
                src_node.index.prim_count(),
                std::back_inserter(bvh.prim_ids));
        } else {
            dst_node.index.set_first_id(bvh.nodes.size());
            stack.emplace(src_node.index.first_id() + 0, bvh.nodes.size() + 0);
            stack.emplace(src_node.index.first_id() + 1, bvh.nodes.size() + 1);
            // Note: This may invalidate `dst_node` so has to happen after any access to it.
            bvh.nodes.emplace_back();
            bvh.nodes.emplace_back();
        }
    }
    return bvh;
}